

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void dump_token(SToken *t)

{
  ostream *poVar1;
  SToken *t_local;
  
  switch(t->type) {
  case LEFT_BRACE:
    poVar1 = std::operator<<((ostream *)&std::cerr,"LEFT_BRACE: ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,t->start);
    poVar1 = std::operator<<(poVar1,", ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,t->length);
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    break;
  case RIGHT_BRACE:
    poVar1 = std::operator<<((ostream *)&std::cerr,"RIGHT_BRACE: ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,t->start);
    poVar1 = std::operator<<(poVar1,", ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,t->length);
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    break;
  case BOOLEAN:
    poVar1 = std::operator<<((ostream *)&std::cerr,"BOOLEAN: ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,t->start);
    poVar1 = std::operator<<(poVar1,", ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,t->length);
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    break;
  case NUMBER:
    poVar1 = std::operator<<((ostream *)&std::cerr,"NUMBER: ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,t->start);
    poVar1 = std::operator<<(poVar1,", ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,t->length);
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    break;
  case STRING:
    poVar1 = std::operator<<((ostream *)&std::cerr,"STRING: ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,t->start);
    poVar1 = std::operator<<(poVar1,", ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,t->length);
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    break;
  case SEPARATOR:
    poVar1 = std::operator<<((ostream *)&std::cerr,"SEPARATOR: ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,t->start);
    poVar1 = std::operator<<(poVar1,", ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,t->length);
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    break;
  case EQUAL:
    poVar1 = std::operator<<((ostream *)&std::cerr,"EQUAL: ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,t->start);
    poVar1 = std::operator<<(poVar1,", ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,t->length);
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    break;
  default:
    poVar1 = std::operator<<((ostream *)&std::cerr,"Unexpected value of token type");
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  }
  return;
}

Assistant:

void dump_token(const SToken& t)
{
    switch (t.type)
    {
        case LEFT_BRACE:
            std::cerr << "LEFT_BRACE: " << t.start << ", " << t.length << std::endl;
            break;
            
        case RIGHT_BRACE:
            std::cerr << "RIGHT_BRACE: " << t.start << ", " << t.length << std::endl;
            break;
            
        case BOOLEAN:
            std::cerr << "BOOLEAN: " << t.start << ", " << t.length << std::endl;
            break;
            
        case NUMBER:
            std::cerr << "NUMBER: " << t.start << ", " << t.length << std::endl;
            break;
            
        case STRING:
            std::cerr << "STRING: " << t.start << ", " << t.length << std::endl;
            break;
            
        case SEPARATOR:
            std::cerr << "SEPARATOR: " << t.start << ", " << t.length << std::endl;
            break;
            
        case EQUAL:
            std::cerr << "EQUAL: " << t.start << ", " << t.length << std::endl;
            break;
            
        default:
            std::cerr << "Unexpected value of token type" << std::endl;
    }
}